

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O2

void emit_string(char *str,FILE *out)

{
  byte bVar1;
  ushort **ppuVar2;
  uint __c;
  
  do {
    bVar1 = *str;
    __c = (uint)(char)bVar1;
    if (bVar1 == 0) {
      return;
    }
    ppuVar2 = __ctype_b_loc();
    if ((short)(*ppuVar2)[bVar1] < 0) {
LAB_00103ae4:
      putc(__c,(FILE *)out);
    }
    else {
      if (((*ppuVar2)[bVar1] >> 0xd & 1) != 0) {
        __c = 0x5f;
        goto LAB_00103ae4;
      }
      fprintf((FILE *)out,"\\%.3o",(ulong)__c);
    }
    str = (char *)((byte *)str + 1);
  } while( true );
}

Assistant:

static void
emit_string(const char *str, FILE *out)
   /* Print a string with spaces replaced by '_' and non-printing characters by
    * an octal escape.
    */
{
   for (; *str; ++str)
      if (isgraph(UCHAR_MAX & *str))
         putc(*str, out);

      else if (isspace(UCHAR_MAX & *str))
         putc('_', out);

      else
         fprintf(out, "\\%.3o", *str);
}